

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildFloat(string_view t_val)

{
  byte bVar1;
  bool bVar2;
  long in_RDX;
  size_type in_RSI;
  size_type __n;
  bool bVar4;
  element_type *in_RDI;
  uint uVar5;
  byte bVar6;
  type_conflict3 tVar7;
  type_conflict2 tVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  Boxed_Value BVar10;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  type_conflict2 local_18;
  undefined2 uStack_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  bVar2 = false;
  bVar4 = false;
  while (__n = in_RSI, __n != 0) {
    bVar1 = *(byte *)(in_RDX + -1 + __n);
    bVar6 = bVar1 & 0xdf;
    if (bVar6 != 0x46) {
      bVar2 = (bool)(bVar6 == 0x4c | bVar2);
    }
    bVar4 = (bool)(bVar4 | bVar6 == 0x46);
    uVar5 = bVar1 - 0x46;
    if ((0x26 < uVar5) || (in_RSI = __n - 1, (0x4100000041U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
    break;
  }
  if (bVar4) {
    bVar9 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_28,0,__n);
    t_str._M_str = bVar9._M_str;
    t_str._M_len = (size_t)t_str._M_str;
    tVar7 = parse_num<float>((chaiscript *)bVar9._M_len,t_str);
    _local_18 = CONCAT64(stack0xffffffffffffffec,tVar7);
    BVar10 = detail::const_var_impl<float>((float *)in_RDI);
    _Var3._M_pi = BVar10.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else if (bVar2) {
    bVar9 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_28,0,__n);
    t_str_00._M_str = bVar9._M_str;
    t_str_00._M_len = (size_t)t_str_00._M_str;
    parse_num<long_double>((type_conflict4 *)bVar9._M_len,t_str_00);
    BVar10 = detail::const_var_impl<long_double>((longdouble *)in_RDI);
    _Var3._M_pi = BVar10.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    bVar9 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_28,0,__n);
    t_str_01._M_str = bVar9._M_str;
    t_str_01._M_len = (size_t)t_str_01._M_str;
    tVar8 = parse_num<double>((chaiscript *)bVar9._M_len,t_str_01);
    _local_18 = CONCAT28(uStack_10,tVar8);
    BVar10 = detail::const_var_impl<double>((double *)in_RDI);
    _Var3._M_pi = BVar10.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildFloat(std::string_view t_val) {
        bool float_ = false;
        bool long_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          char val = t_val[i - 1];

          if (val == 'f' || val == 'F') {
            float_ = true;
          } else if (val == 'l' || val == 'L') {
            long_ = true;
          } else {
            break;
          }
        }

        if (float_) {
          return const_var(parse_num<float>(t_val.substr(0, i)));
        } else if (long_) {
          return const_var(parse_num<long double>(t_val.substr(0, i)));
        } else {
          return const_var(parse_num<double>(t_val.substr(0, i)));
        }
      }